

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O0

Box<Imath_3_2::Vec3<float>_> *
Imath_3_2::transform<float,float>(Box<Imath_3_2::Vec3<float>_> *box,Matrix44<float> *m)

{
  float fVar1;
  Vec3<float> *pVVar2;
  bool bVar3;
  float *pfVar4;
  Matrix44<float> *in_RDX;
  Box<Imath_3_2::Vec3<float>_> *in_RSI;
  Box<Imath_3_2::Vec3<float>_> *in_RDI;
  float fVar5;
  int i_1;
  Vec3<float> points [8];
  float b;
  float a;
  int j;
  int i;
  Box<Imath_3_2::Vec3<float>_> *newBox;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  float fVar6;
  undefined4 in_stack_ffffffffffffff10;
  float fVar7;
  undefined4 in_stack_ffffffffffffff14;
  float fVar8;
  Box<Imath_3_2::Vec3<float>_> *in_stack_ffffffffffffff28;
  Vec3<float> *v;
  Vec3<float> *local_d0;
  int local_8c;
  Vec3<float> local_88;
  Vec3<float> VStack_7c;
  Vec3<float> VStack_70;
  Vec3<float> VStack_64;
  Vec3<float> VStack_58;
  Vec3<float> VStack_4c;
  Vec3<float> VStack_40;
  Vec3<float> VStack_34;
  Vec3<float> local_28;
  int local_1c;
  Matrix44<float> *local_18;
  Box<Imath_3_2::Vec3<float>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar3 = Box<Imath_3_2::Vec3<float>_>::isEmpty(in_RSI);
  if ((bVar3) ||
     (bVar3 = Box<Imath_3_2::Vec3<float>_>::isInfinite(in_stack_ffffffffffffff28), bVar3)) {
    Box<Imath_3_2::Vec3<float>_>::Box
              ((Box<Imath_3_2::Vec3<float>_> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (Box<Imath_3_2::Vec3<float>_> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  }
  else {
    pfVar4 = Matrix44<float>::operator[](local_18,0);
    if ((pfVar4[3] == 0.0) && (!NAN(pfVar4[3]))) {
      pfVar4 = Matrix44<float>::operator[](local_18,1);
      if ((pfVar4[3] == 0.0) && (!NAN(pfVar4[3]))) {
        pfVar4 = Matrix44<float>::operator[](local_18,2);
        if ((pfVar4[3] == 0.0) && (!NAN(pfVar4[3]))) {
          pfVar4 = Matrix44<float>::operator[](local_18,3);
          if ((pfVar4[3] == 1.0) && (!NAN(pfVar4[3]))) {
            Box<Imath_3_2::Vec3<float>_>::Box
                      ((Box<Imath_3_2::Vec3<float>_> *)
                       CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
            for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
              pfVar4 = Matrix44<float>::operator[](local_18,3);
              fVar5 = pfVar4[local_1c];
              pfVar4 = Vec3<float>::operator[](&in_RDI->max,local_1c);
              *pfVar4 = fVar5;
              pfVar4 = Vec3<float>::operator[](&in_RDI->min,local_1c);
              *pfVar4 = fVar5;
              for (local_28.z = 0.0; (int)local_28.z < 3; local_28.z = (float)((int)local_28.z + 1))
              {
                pfVar4 = Matrix44<float>::operator[](local_18,(int)local_28.z);
                fVar5 = pfVar4[local_1c];
                pfVar4 = Vec3<float>::operator[](&local_10->min,(int)local_28.z);
                local_28.y = fVar5 * *pfVar4;
                pfVar4 = Matrix44<float>::operator[](local_18,(int)local_28.z);
                fVar5 = pfVar4[local_1c];
                pfVar4 = Vec3<float>::operator[](&local_10->max,(int)local_28.z);
                fVar6 = local_28.y;
                fVar5 = fVar5 * *pfVar4;
                local_28.x = fVar5;
                if (fVar5 <= local_28.y) {
                  pfVar4 = Vec3<float>::operator[](&in_RDI->min,local_1c);
                  fVar6 = local_28.y;
                  *pfVar4 = fVar5 + *pfVar4;
                  pfVar4 = Vec3<float>::operator[](&in_RDI->max,local_1c);
                  *pfVar4 = fVar6 + *pfVar4;
                }
                else {
                  pfVar4 = Vec3<float>::operator[](&in_RDI->min,local_1c);
                  fVar5 = local_28.x;
                  *pfVar4 = fVar6 + *pfVar4;
                  pfVar4 = Vec3<float>::operator[](&in_RDI->max,local_1c);
                  *pfVar4 = fVar5 + *pfVar4;
                }
              }
            }
            return in_RDI;
          }
        }
      }
    }
    v = &local_28;
    pVVar2 = &local_88;
    do {
      local_d0 = pVVar2;
      Vec3<float>::Vec3(local_d0);
      pVVar2 = local_d0 + 1;
    } while (local_d0 + 1 != v);
    pfVar4 = Vec3<float>::operator[](&local_10->min,0);
    fVar5 = *pfVar4;
    pfVar4 = Vec3<float>::operator[](&VStack_64,0);
    *pfVar4 = fVar5;
    pfVar4 = Vec3<float>::operator[](&VStack_70,0);
    *pfVar4 = fVar5;
    pfVar4 = Vec3<float>::operator[](&VStack_7c,0);
    *pfVar4 = fVar5;
    pfVar4 = Vec3<float>::operator[](&local_88,0);
    *pfVar4 = fVar5;
    pfVar4 = Vec3<float>::operator[](&local_10->max,0);
    fVar6 = *pfVar4;
    pfVar4 = Vec3<float>::operator[](&VStack_34,0);
    *pfVar4 = fVar6;
    pfVar4 = Vec3<float>::operator[](&VStack_40,0);
    *pfVar4 = fVar6;
    pfVar4 = Vec3<float>::operator[](&VStack_4c,0);
    *pfVar4 = fVar6;
    pfVar4 = Vec3<float>::operator[](&VStack_58,0);
    *pfVar4 = fVar6;
    pfVar4 = Vec3<float>::operator[](&local_10->min,1);
    fVar7 = *pfVar4;
    pfVar4 = Vec3<float>::operator[](&VStack_4c,1);
    *pfVar4 = fVar7;
    pfVar4 = Vec3<float>::operator[](&VStack_58,1);
    *pfVar4 = fVar7;
    pfVar4 = Vec3<float>::operator[](&VStack_7c,1);
    *pfVar4 = fVar7;
    pfVar4 = Vec3<float>::operator[](&local_88,1);
    *pfVar4 = fVar7;
    pfVar4 = Vec3<float>::operator[](&local_10->max,1);
    fVar8 = *pfVar4;
    pfVar4 = Vec3<float>::operator[](&VStack_34,1);
    *pfVar4 = fVar8;
    pfVar4 = Vec3<float>::operator[](&VStack_40,1);
    *pfVar4 = fVar8;
    pfVar4 = Vec3<float>::operator[](&VStack_64,1);
    *pfVar4 = fVar8;
    pfVar4 = Vec3<float>::operator[](&VStack_70,1);
    *pfVar4 = fVar8;
    pfVar4 = Vec3<float>::operator[](&local_10->min,2);
    fVar1 = *pfVar4;
    pfVar4 = Vec3<float>::operator[](&VStack_40,2);
    *pfVar4 = fVar1;
    pfVar4 = Vec3<float>::operator[](&VStack_58,2);
    *pfVar4 = fVar1;
    pfVar4 = Vec3<float>::operator[](&VStack_70,2);
    *pfVar4 = fVar1;
    pfVar4 = Vec3<float>::operator[](&local_88,2);
    *pfVar4 = fVar1;
    pfVar4 = Vec3<float>::operator[](&local_10->max,2);
    fVar1 = *pfVar4;
    pfVar4 = Vec3<float>::operator[](&VStack_34,2);
    *pfVar4 = fVar1;
    pfVar4 = Vec3<float>::operator[](&VStack_4c,2);
    *pfVar4 = fVar1;
    pfVar4 = Vec3<float>::operator[](&VStack_64,2);
    *pfVar4 = fVar1;
    pfVar4 = Vec3<float>::operator[](&VStack_7c,2);
    *pfVar4 = fVar1;
    Box<Imath_3_2::Vec3<float>_>::Box((Box<Imath_3_2::Vec3<float>_> *)CONCAT44(fVar8,fVar7));
    for (local_8c = 0; local_8c < 8; local_8c = local_8c + 1) {
      operator*(v,(Matrix44<float> *)local_d0);
      Box<Imath_3_2::Vec3<float>_>::extendBy
                ((Box<Imath_3_2::Vec3<float>_> *)CONCAT44(fVar8,fVar7),
                 (Vec3<float> *)CONCAT44(fVar6,fVar5));
    }
  }
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE Box<Vec3<S>>
transform (const Box<Vec3<S>>& box, const Matrix44<T>& m) IMATH_NOEXCEPT
{
    if (box.isEmpty () || box.isInfinite ()) return box;

    //
    // If the last column of m is (0 0 0 1) then m is an affine
    // transform, and we use the fast Graphics Gems trick.
    //

    if (m[0][3] == 0 && m[1][3] == 0 && m[2][3] == 0 && m[3][3] == 1)
    {
        Box<Vec3<S>> newBox;

        for (int i = 0; i < 3; i++)
        {
            newBox.min[i] = newBox.max[i] = (S) m[3][i];

            for (int j = 0; j < 3; j++)
            {
                S a, b;

                a = (S) m[j][i] * box.min[j];
                b = (S) m[j][i] * box.max[j];

                if (a < b)
                {
                    newBox.min[i] += a;
                    newBox.max[i] += b;
                }
                else
                {
                    newBox.min[i] += b;
                    newBox.max[i] += a;
                }
            }
        }

        return newBox;
    }

    //
    // M is a projection matrix.  Do things the naive way:
    // Transform the eight corners of the box, and find an
    // axis-parallel box that encloses the transformed corners.
    //

    Vec3<S> points[8];

    points[0][0] = points[1][0] = points[2][0] = points[3][0] = box.min[0];
    points[4][0] = points[5][0] = points[6][0] = points[7][0] = box.max[0];

    points[0][1] = points[1][1] = points[4][1] = points[5][1] = box.min[1];
    points[2][1] = points[3][1] = points[6][1] = points[7][1] = box.max[1];

    points[0][2] = points[2][2] = points[4][2] = points[6][2] = box.min[2];
    points[1][2] = points[3][2] = points[5][2] = points[7][2] = box.max[2];

    Box<Vec3<S>> newBox;

    for (int i = 0; i < 8; i++)
        newBox.extendBy (points[i] * m);

    return newBox;
}